

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O0

_Bool upb_strtable_resize(upb_strtable *t,size_t size_lg2,upb_Arena *a)

{
  _Bool _Var1;
  uint uVar2;
  upb_value local_68;
  upb_value val;
  upb_StringView key;
  intptr_t iter;
  upb_strtable new_table;
  upb_Arena *a_local;
  size_t size_lg2_local;
  upb_strtable *t_local;
  
  new_table.t.entries = (upb_tabent *)a;
  uVar2 = init((EVP_PKEY_CTX *)&iter);
  if ((uVar2 & 1) == 0) {
    t_local._7_1_ = false;
  }
  else {
    key.size = 0xffffffffffffffff;
    while( true ) {
      _Var1 = upb_strtable_next2(t,(upb_StringView *)&val,&local_68,(intptr_t *)&key.size);
      if (!_Var1) break;
      upb_strtable_insert((upb_strtable *)&iter,(char *)val.val,(size_t)key.data,local_68,
                          (upb_Arena *)new_table.t.entries);
    }
    (t->t).count = iter;
    (t->t).mask = (undefined4)new_table.t.count;
    (t->t).max_count = new_table.t.count._4_4_;
    *(undefined8 *)&(t->t).size_lg2 = new_table.t._8_8_;
    (t->t).entries = (upb_tabent *)new_table.t._16_8_;
    t_local._7_1_ = true;
  }
  return t_local._7_1_;
}

Assistant:

bool upb_strtable_resize(upb_strtable* t, size_t size_lg2, upb_Arena* a) {
  upb_strtable new_table;
  if (!init(&new_table.t, size_lg2, a)) return false;

  intptr_t iter = UPB_STRTABLE_BEGIN;
  upb_StringView key;
  upb_value val;
  while (upb_strtable_next2(t, &key, &val, &iter)) {
    upb_strtable_insert(&new_table, key.data, key.size, val, a);
  }
  *t = new_table;
  return true;
}